

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::ICULCPTranscoder::transcode
          (ICULCPTranscoder *this,XMLCh *toTranscode,char *toFill,XMLSize_t maxChars,
          MemoryManager *manager)

{
  UBool UVar1;
  XMLMutexLock local_68;
  XMLMutexLock lockConverter;
  int32_t targetCap;
  UErrorCode err;
  ArrayJanitor<char16_t> janTmp;
  UChar *ncActual;
  UChar *actualSrc;
  MemoryManager *manager_local;
  XMLSize_t maxChars_local;
  char *toFill_local;
  XMLCh *toTranscode_local;
  ICULCPTranscoder *this_local;
  
  if ((toTranscode == (XMLCh *)0x0) || (maxChars == 0)) {
    *toFill = '\0';
    this_local._7_1_ = true;
  }
  else if (*toTranscode == L'\0') {
    *toFill = '\0';
    this_local._7_1_ = true;
  }
  else {
    janTmp.fMemoryManager = (MemoryManager *)0x0;
    ArrayJanitor<char16_t>::ArrayJanitor
              ((ArrayJanitor<char16_t> *)&targetCap,(char16_t *)0x0,manager);
    lockConverter.fToLock._4_4_ = U_ZERO_ERROR;
    XMLMutexLock::XMLMutexLock(&local_68,&this->fMutex);
    lockConverter.fToLock._0_4_ =
         ucnv_fromUChars_70(this->fConverter,toFill,maxChars & 0xffffffff,toTranscode,0xffffffff,
                            (undefined1 *)((long)&lockConverter.fToLock + 4));
    XMLMutexLock::~XMLMutexLock(&local_68);
    UVar1 = U_FAILURE(lockConverter.fToLock._4_4_);
    this_local._7_1_ = UVar1 == '\0';
    if (this_local._7_1_) {
      toFill[(int)lockConverter.fToLock] = '\0';
    }
    ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&targetCap);
  }
  return this_local._7_1_;
}

Assistant:

bool ICULCPTranscoder::transcode(   const   XMLCh* const    toTranscode
                                    ,       char* const     toFill
                                    , const XMLSize_t       maxChars
                                    , MemoryManager* const  manager)
{
    // Watch for a few psycho corner cases
    if (!toTranscode || !maxChars)
    {
        toFill[0] = 0;
        return true;
    }

    if (!*toTranscode)
    {
        toFill[0] = 0;
        return true;
    }

    //
    //  If XMLCh and UChar are not the same size, then we have to make a
    //  temp copy of the text to pass to ICU.
    //
    const UChar* actualSrc;
    UChar* ncActual = 0;
    if (sizeof(XMLCh) == sizeof(UChar))
    {
        actualSrc = (const UChar*)toTranscode;
    }
    else
    {
        // Allocate a non-const temp buf, but store it also in the actual
        ncActual = convertToUChar(toTranscode, 0, manager);
        actualSrc = ncActual;
    }

    // Insure that the temp buffer, if any, gets cleaned up via the nc pointer
    ArrayJanitor<UChar> janTmp(ncActual, manager);

    //
    //  Use a faux block to enforce a lock on the converter while we do this.
    //  It will be released immediately after its done.
    //
    UErrorCode err = U_ZERO_ERROR;
    int32_t targetCap;
    {
        XMLMutexLock lockConverter(&fMutex);
        targetCap = ucnv_fromUChars
        (
            fConverter
            , toFill
            , (int32_t)maxChars
            , actualSrc
            , -1
            , &err
        );
    }

    if (U_FAILURE(err))
        return false;

    toFill[targetCap] = 0;
    return true;
}